

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O1

void __thiscall HighsNodeQueue::link_domchgs(HighsNodeQueue *this,int64_t node)

{
  pointer pOVar1;
  long lVar2;
  set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>
  *psVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  pair<std::_Rb_tree_iterator<std::pair<double,_long>_>,_bool> pVar7;
  double val;
  int64_t local_38;
  double local_30;
  
  pOVar1 = (this->nodes).
           super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
           _M_impl.super__Vector_impl_data._M_start + node;
  uVar6 = (ulong)((long)*(pointer *)
                         ((long)&(pOVar1->domchgstack).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl + 8) -
                 *(long *)&(pOVar1->domchgstack).
                           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                           ._M_impl) >> 4;
  iVar5 = (int)uVar6;
  local_38 = node;
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
  ::resize(&pOVar1->domchglinks,(long)iVar5);
  if (iVar5 != 0) {
    uVar6 = uVar6 & 0xffffffff;
    lVar4 = 0;
    do {
      lVar2 = *(long *)&(this->nodes).
                        super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_38].domchgstack.
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl;
      local_30 = *(double *)(lVar2 + lVar4 * 2);
      iVar5 = *(int *)(lVar2 + 0xc + lVar4 * 2);
      if (iVar5 == 1) {
        psVar3 = (this->colUpperNodesPtr)._M_t.
                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                 .
                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                 ._M_head_impl;
LAB_002d0820:
        pVar7 = std::
                _Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
                ::_M_emplace_unique<double&,long&>
                          ((_Rb_tree<std::pair<double,long>,std::pair<double,long>,std::_Identity<std::pair<double,long>>,std::less<std::pair<double,long>>,HighsNodeQueue::NodesetAllocator<std::pair<double,long>>>
                            *)((long)psVar3 + (long)*(int *)(lVar2 + 8 + lVar4 * 2) * 0x38),
                           &local_30,&local_38);
        *(_Base_ptr *)
         (*(long *)&(this->nodes).
                    super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_38].domchglinks.
                    super__Vector_base<std::_Rb_tree_const_iterator<std::pair<double,_long>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<double,_long>_>_>_>
                    ._M_impl.super__Vector_impl_data + lVar4) = pVar7.first._M_node._M_node;
      }
      else if (iVar5 == 0) {
        psVar3 = (this->colLowerNodesPtr)._M_t.
                 super___uniq_ptr_impl<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_HighsNodeQueue::GlobalOperatorDelete>
                 .
                 super__Head_base<0UL,_std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>_*,_false>
                 ._M_head_impl;
        goto LAB_002d0820;
      }
      lVar4 = lVar4 + 8;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void HighsNodeQueue::link_domchgs(int64_t node) {
  assert(node != -1);
  HighsInt numchgs = nodes[node].domchgstack.size();
  nodes[node].domchglinks.resize(numchgs);

  for (HighsInt i = 0; i != numchgs; ++i) {
    double val = nodes[node].domchgstack[i].boundval;
    HighsInt col = nodes[node].domchgstack[i].column;
    switch (nodes[node].domchgstack[i].boundtype) {
      case HighsBoundType::kLower:
        nodes[node].domchglinks[i] =
            colLowerNodesPtr.get()[col].emplace(val, node).first;
        break;
      case HighsBoundType::kUpper:
        nodes[node].domchglinks[i] =
            colUpperNodesPtr.get()[col].emplace(val, node).first;
    }
  }
}